

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O0

RecyclableObject *
Js::JavascriptOperators::GetIteratorFunction
          (RecyclableObject *instance,ScriptContext *scriptContext,bool optional)

{
  bool bVar1;
  BOOL BVar2;
  Var instance_00;
  RecyclableObject *pRVar3;
  RecyclableObject *function;
  Var func;
  bool optional_local;
  ScriptContext *scriptContext_local;
  RecyclableObject *instance_local;
  
  instance_00 = GetPropertyNoCache(instance,0x14,scriptContext);
  if ((optional) && (BVar2 = IsUndefinedOrNull(instance_00), BVar2 != 0)) {
    return (RecyclableObject *)0x0;
  }
  bVar1 = JavascriptConversion::IsCallable(instance_00);
  if (bVar1) {
    pRVar3 = VarTo<Js::RecyclableObject>(instance_00);
    return pRVar3;
  }
  JavascriptError::ThrowTypeError(scriptContext,-0x7ff5ec45,(PCWSTR)0x0);
}

Assistant:

RecyclableObject* JavascriptOperators::GetIteratorFunction(RecyclableObject* instance, ScriptContext * scriptContext, bool optional)
    {
        Var func = JavascriptOperators::GetPropertyNoCache(instance, PropertyIds::_symbolIterator, scriptContext);

        if (optional && JavascriptOperators::IsUndefinedOrNull(func))
        {
            return nullptr;
        }

        if (!JavascriptConversion::IsCallable(func))
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_Property_NeedFunction);
        }

        RecyclableObject* function = VarTo<RecyclableObject>(func);
        return function;
    }